

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  undefined1 auVar5 [32];
  __m256i c;
  __m256i vH;
  __m256i vH_00;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined4 uVar9;
  int iVar10;
  parasail_result_t *result;
  __m256i *palVar11;
  __m256i *palVar12;
  __m256i *b;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  int iVar16;
  undefined4 in_register_00000014;
  __m256i *ptr;
  ulong uVar17;
  uint uVar18;
  char *__format;
  int iVar19;
  undefined8 in_R9;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  undefined2 uVar23;
  undefined2 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  uint seglen;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 uVar32;
  uint d;
  undefined4 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5c;
  short sVar33;
  undefined2 in_stack_fffffffffffffe5e;
  undefined2 uVar34;
  __m256i *local_198;
  undefined1 local_158 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "open";
        }
        else {
          if (-1 < gap) {
            iVar10 = ppVar4->max;
            result = parasail_result_new_table1((uint)((ulong)uVar2 + 0xf) & 0x7ffffff0,s2Len);
            if (result != (parasail_result_t *)0x0) {
              uVar22 = (ulong)uVar2 + 0xf >> 4;
              result->flag = result->flag | 0x10220804;
              palVar11 = parasail_memalign___m256i(0x20,uVar22);
              palVar12 = parasail_memalign___m256i(0x20,uVar22);
              local_198 = parasail_memalign___m256i(0x20,uVar22);
              b = parasail_memalign___m256i(0x20,uVar22);
              uVar18 = 0;
              uVar9 = 0;
              if ((b != (__m256i *)0x0 && local_198 != (__m256i *)0x0) &&
                  (palVar12 != (__m256i *)0x0 && palVar11 != (__m256i *)0x0)) {
                uVar23 = (undefined2)open;
                uVar24 = (undefined2)gap;
                alVar1[0]._4_4_ = in_stack_fffffffffffffe4c;
                alVar1[0]._0_4_ = open;
                alVar1[1]._0_4_ = s2Len;
                alVar1[1]._4_4_ = in_register_00000014;
                alVar1[2]._0_4_ = in_stack_fffffffffffffe58;
                alVar1[2]._4_2_ = in_stack_fffffffffffffe5c;
                alVar1[2]._6_2_ = in_stack_fffffffffffffe5e;
                alVar1[3] = 0;
                parasail_memset___m256i(palVar11,alVar1,uVar22);
                c[0]._4_4_ = in_stack_fffffffffffffe4c;
                c[0]._0_4_ = open;
                c[1]._0_4_ = s2Len;
                c[1]._4_4_ = in_register_00000014;
                c[2]._0_4_ = in_stack_fffffffffffffe58;
                c[2]._4_2_ = in_stack_fffffffffffffe5c;
                c[2]._6_2_ = in_stack_fffffffffffffe5e;
                c[3]._0_4_ = uVar18;
                c[3]._4_4_ = uVar9;
                parasail_memset___m256i(b,c,uVar22);
                seglen = (uint)uVar22;
                uVar14 = seglen - 1;
                uVar13 = (ulong)(uint)s2Len;
                auVar27._8_2_ = 0x8000;
                auVar27._0_8_ = 0x8000800080008000;
                auVar27._10_2_ = 0x8000;
                auVar27._12_2_ = 0x8000;
                auVar27._14_2_ = 0x8000;
                auVar27._16_2_ = 0x8000;
                auVar27._18_2_ = 0x8000;
                auVar27._20_2_ = 0x8000;
                auVar27._22_2_ = 0x8000;
                auVar27._24_2_ = 0x8000;
                auVar27._26_2_ = 0x8000;
                auVar27._28_2_ = 0x8000;
                auVar27._30_2_ = 0x8000;
                uVar34 = (undefined2)((uint)s2Len >> 0x10);
                sVar33 = -0x8000;
                uVar21 = 0;
                auVar31 = ZEXT3264(CONCAT824(0x8000800080008000,
                                             CONCAT816(0x8000800080008000,
                                                       CONCAT88(0x8000800080008000,
                                                                0x8000800080008000))));
                uVar32 = 0;
                do {
                  ptr = palVar11;
                  d = s2Len;
                  if (uVar21 == uVar13) {
LAB_00769721:
                    if (sVar33 == 0x7fff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar10 = parasail_result_is_saturated(result);
                    palVar11 = local_198;
                    if (iVar10 == 0) {
                      if (uVar18 == d - 2) {
                        palVar11 = palVar12;
                      }
                      if (uVar18 == d - 1) {
                        palVar11 = ptr;
                        ptr = local_198;
                      }
                      iVar10 = uVar2 - 1;
                      for (uVar22 = 0; (seglen & 0x7ffffff) << 4 != (uint)uVar22;
                          uVar22 = uVar22 + 1) {
                        if ((*(short *)((long)*palVar11 + uVar22 * 2) == sVar33) &&
                           (iVar19 = ((uint)uVar22 & 0xf) * seglen +
                                     ((uint)(uVar22 >> 4) & 0xfffffff), iVar19 < iVar10)) {
                          iVar10 = iVar19;
                        }
                      }
                      if (uVar18 != d - 2) {
                        local_198 = palVar12;
                      }
                      if (uVar18 != d - 1) {
                        palVar12 = local_198;
                      }
                      iVar19 = sVar33 + 0x8000;
                    }
                    else {
                      uVar18 = 0;
                      iVar19 = 0xffff;
                      iVar10 = 0;
                    }
                    result->score = iVar19;
                    result->end_query = iVar10;
                    result->end_ref = uVar18;
                    parasail_free(b);
                    parasail_free(palVar11);
                    parasail_free(palVar12);
                    parasail_free(ptr);
                    return result;
                  }
                  local_158 = auVar31._0_32_;
                  alVar1 = palVar11[uVar14];
                  auVar25 = alVar1._0_16_;
                  auVar28._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar25;
                  auVar28._16_16_ = ZEXT116(0) * alVar1._16_16_ + ZEXT116(1) * auVar25;
                  auVar28 = vpalignr_avx2((undefined1  [32])alVar1,auVar28,0xe);
                  auVar25._8_8_ = 0x8000800080008000;
                  auVar25._0_8_ = 0x8000800080008000;
                  auVar30._16_8_ = 0x8000800080008000;
                  auVar30._0_16_ = auVar25;
                  auVar30._24_8_ = 0x8000800080008000;
                  auVar25 = vpblendw_avx(auVar28._0_16_,auVar25,1);
                  auVar28 = vpblendd_avx2(ZEXT1632(auVar25),auVar28,0xf0);
                  iVar19 = ppVar4->mapper[(byte)s2[uVar21]];
                  iVar16 = (int)uVar22;
                  d = (uint)uVar21;
                  ptr = palVar12;
                  if (uVar18 == d - 2) {
                    ptr = local_198;
                  }
                  lVar20 = 0;
                  for (uVar17 = 0; uVar22 != uVar17; uVar17 = uVar17 + 1) {
                    auVar26 = vpaddsw_avx2(auVar28,*(undefined1 (*) [32])
                                                    ((long)pvVar3 +
                                                    lVar20 + (long)(iVar19 * iVar16) * 0x20));
                    auVar28 = *(undefined1 (*) [32])((long)*b + lVar20);
                    auVar5 = vpmaxsw_avx2(auVar28,auVar30);
                    auVar26 = vpmaxsw_avx2(auVar26,auVar5);
                    *(undefined1 (*) [32])((long)*ptr + lVar20) = auVar26;
                    vH[0]._4_4_ = uVar32;
                    vH[0]._0_4_ = seglen;
                    vH[1]._0_4_ = s2Len;
                    vH[1]._4_4_ = in_register_00000014;
                    vH[2]._0_4_ = in_stack_fffffffffffffe58;
                    vH[2]._4_2_ = sVar33;
                    vH[2]._6_2_ = uVar34;
                    vH[3]._0_4_ = uVar18;
                    vH[3]._4_4_ = uVar9;
                    arr_store_si256(((result->field_4).rowcols)->score_row,vH,(int32_t)uVar17,seglen
                                    ,d,s2Len,(int32_t)in_R9);
                    uVar22 = CONCAT44(uVar32,seglen);
                    local_158 = vpmaxsw_avx2(auVar26,local_158);
                    auVar7._2_2_ = uVar23;
                    auVar7._0_2_ = uVar23;
                    auVar7._4_2_ = uVar23;
                    auVar7._6_2_ = uVar23;
                    auVar7._8_2_ = uVar23;
                    auVar7._10_2_ = uVar23;
                    auVar7._12_2_ = uVar23;
                    auVar7._14_2_ = uVar23;
                    auVar7._16_2_ = uVar23;
                    auVar7._18_2_ = uVar23;
                    auVar7._20_2_ = uVar23;
                    auVar7._22_2_ = uVar23;
                    auVar7._24_2_ = uVar23;
                    auVar7._26_2_ = uVar23;
                    auVar7._28_2_ = uVar23;
                    auVar7._30_2_ = uVar23;
                    auVar26 = vpsubsw_avx2(auVar26,auVar7);
                    auVar5._2_2_ = uVar24;
                    auVar5._0_2_ = uVar24;
                    auVar5._4_2_ = uVar24;
                    auVar5._6_2_ = uVar24;
                    auVar5._8_2_ = uVar24;
                    auVar5._10_2_ = uVar24;
                    auVar5._12_2_ = uVar24;
                    auVar5._14_2_ = uVar24;
                    auVar5._16_2_ = uVar24;
                    auVar5._18_2_ = uVar24;
                    auVar5._20_2_ = uVar24;
                    auVar5._22_2_ = uVar24;
                    auVar5._24_2_ = uVar24;
                    auVar5._26_2_ = uVar24;
                    auVar5._28_2_ = uVar24;
                    auVar5._30_2_ = uVar24;
                    auVar28 = vpsubsw_avx2(auVar28,auVar5);
                    auVar28 = vpmaxsw_avx2(auVar28,auVar26);
                    *(undefined1 (*) [32])((long)*b + lVar20) = auVar28;
                    auVar28 = vpsubsw_avx2(auVar30,auVar5);
                    auVar30 = vpmaxsw_avx2(auVar28,auVar26);
                    auVar28 = *(undefined1 (*) [32])((long)*palVar11 + lVar20);
                    lVar20 = lVar20 + 0x20;
                  }
                  if (uVar18 == d - 2) {
                    local_198 = palVar12;
                  }
                  auVar31 = ZEXT3264(local_158);
                  for (iVar19 = 0; iVar19 != 0x10; iVar19 = iVar19 + 1) {
                    auVar26._0_16_ = ZEXT116(0) * auVar30._0_16_ + ZEXT116(1) * auVar28._0_16_;
                    auVar26._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar30._0_16_;
                    auVar28 = vpalignr_avx2(auVar30,auVar26,0xe);
                    auVar25 = vpblendw_avx(auVar28._0_16_,_DAT_008a5fc0,1);
                    auVar30 = vpblendd_avx2(ZEXT1632(auVar25),auVar28,0xf0);
                    uVar17 = 0;
                    palVar12 = ptr;
                    while (uVar22 != uVar17) {
                      alVar1 = (__m256i)vpmaxsw_avx2(auVar30,(undefined1  [32])*palVar12);
                      *palVar12 = alVar1;
                      vH_00[0]._4_4_ = uVar32;
                      vH_00[0]._0_4_ = seglen;
                      vH_00[1]._0_4_ = s2Len;
                      vH_00[1]._4_4_ = in_register_00000014;
                      vH_00[2]._0_4_ = in_stack_fffffffffffffe58;
                      vH_00[2]._4_2_ = sVar33;
                      vH_00[2]._6_2_ = uVar34;
                      vH_00[3]._0_4_ = uVar18;
                      vH_00[3]._4_4_ = uVar9;
                      arr_store_si256(((result->field_4).rowcols)->score_row,vH_00,(int32_t)uVar17,
                                      (int32_t)uVar22,d,s2Len,(int32_t)in_R9);
                      auVar28 = vpmaxsw_avx2((undefined1  [32])alVar1,auVar31._0_32_);
                      auVar31 = ZEXT3264(auVar28);
                      auVar8._2_2_ = uVar23;
                      auVar8._0_2_ = uVar23;
                      auVar8._4_2_ = uVar23;
                      auVar8._6_2_ = uVar23;
                      auVar8._8_2_ = uVar23;
                      auVar8._10_2_ = uVar23;
                      auVar8._12_2_ = uVar23;
                      auVar8._14_2_ = uVar23;
                      auVar8._16_2_ = uVar23;
                      auVar8._18_2_ = uVar23;
                      auVar8._20_2_ = uVar23;
                      auVar8._22_2_ = uVar23;
                      auVar8._24_2_ = uVar23;
                      auVar8._26_2_ = uVar23;
                      auVar8._28_2_ = uVar23;
                      auVar8._30_2_ = uVar23;
                      auVar28 = vpsubsw_avx2((undefined1  [32])alVar1,auVar8);
                      auVar6._2_2_ = uVar24;
                      auVar6._0_2_ = uVar24;
                      auVar6._4_2_ = uVar24;
                      auVar6._6_2_ = uVar24;
                      auVar6._8_2_ = uVar24;
                      auVar6._10_2_ = uVar24;
                      auVar6._12_2_ = uVar24;
                      auVar6._14_2_ = uVar24;
                      auVar6._16_2_ = uVar24;
                      auVar6._18_2_ = uVar24;
                      auVar6._20_2_ = uVar24;
                      auVar6._22_2_ = uVar24;
                      auVar6._24_2_ = uVar24;
                      auVar6._26_2_ = uVar24;
                      auVar6._28_2_ = uVar24;
                      auVar6._30_2_ = uVar24;
                      auVar30 = vpsubsw_avx2(auVar30,auVar6);
                      auVar28 = vpcmpgtw_avx2(auVar30,auVar28);
                      if ((((((((((((((((((((((((((((((((auVar28 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar28 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar28 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar28 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar28 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar28 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar28 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar28 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar28 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar28 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar28 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar28 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar28 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar28 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar28 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar28 >> 0x7f,0) == '\0') &&
                                        (auVar28 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar28 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar28 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar28 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar28 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar28 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar28 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar28 >> 0xbf,0) == '\0') &&
                                (auVar28 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar28 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar28 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar28 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar28 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar28 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar28 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar28[0x1f]) {
                        uVar22 = CONCAT44(uVar32,seglen);
                        goto LAB_00769697;
                      }
                      uVar17 = uVar17 + 1;
                      palVar12 = palVar12 + 1;
                      uVar22 = CONCAT44(uVar32,seglen);
                    }
                  }
LAB_00769697:
                  auVar30 = auVar31._0_32_;
                  auVar28 = vpcmpgtw_avx2(auVar30,auVar27);
                  palVar12 = palVar11;
                  if ((((((((((((((((((((((((((((((((auVar28 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar28 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar28 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar28 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar28 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar28 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar28 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar28 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar28 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar28 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar28 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar28 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar28 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar28 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar28 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar28 >> 0x7f,0) != '\0')
                                    || (auVar28 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar28 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar28 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar28 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar28 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar28 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar28 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar28 >> 0xbf,0) != '\0') ||
                            (auVar28 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar28 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar28 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar28 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar28 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar28 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar28 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar28[0x1f] < '\0') {
                    auVar27 = vpermq_avx2(auVar30,0x44);
                    auVar27 = vpmaxsw_avx2(auVar30,auVar27);
                    auVar28 = vpslldq_avx2(auVar27,8);
                    auVar27 = vpmaxsw_avx2(auVar27,auVar28);
                    auVar28 = vpslldq_avx2(auVar27,4);
                    auVar27 = vpmaxsw_avx2(auVar27,auVar28);
                    auVar28 = vpslldq_avx2(auVar27,2);
                    auVar27 = vpmaxsw_avx2(auVar27,auVar28);
                    uVar9 = vpextrw_avx(auVar27._16_16_,7);
                    sVar33 = (short)uVar9;
                    uVar34 = (undefined2)((uint)uVar9 >> 0x10);
                    if ((short)(0x7ffe - (short)iVar10) < sVar33) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      goto LAB_00769721;
                    }
                    auVar27 = vpshufhw_avx2(auVar27,0xff);
                    auVar29._8_4_ = 6;
                    auVar29._0_8_ = 0x600000006;
                    auVar29._12_4_ = 6;
                    auVar29._16_4_ = 6;
                    auVar29._20_4_ = 6;
                    auVar29._24_4_ = 6;
                    auVar29._28_4_ = 6;
                    auVar27 = vpermd_avx2(auVar29,auVar27);
                    uVar9 = 0;
                    uVar18 = d;
                  }
                  uVar21 = uVar21 + 1;
                  palVar11 = ptr;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_striped_profile_avx2_256_16",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int16_t maxp = 0;
    __m256i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm256_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi16(
            _mm256_set_epi16(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}